

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skeleton.cpp
# Opt level: O2

Joint * __thiscall
CMU462::DynamicScene::Skeleton::loadJoint
          (Skeleton *this,XMLElement *jointNode,
          set<double,_std::less<double>,_std::allocator<double>_> *knotTimes)

{
  SceneObject *pSVar1;
  Skeleton *this_00;
  Joint *this_01;
  XMLElement *pXVar2;
  XMLElement *pXVar3;
  ostream *poVar4;
  vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_> *this_02;
  double dVar5;
  double time;
  Joint *joint;
  Joint *local_b0;
  double local_a8;
  double local_a0;
  XMLElement *local_98;
  Joint *local_90;
  Skeleton *local_88;
  Joint *local_80;
  Vector3D local_78;
  Vector3D local_60;
  Vector3D local_48;
  
  local_98 = jointNode;
  if (jointNode == (XMLElement *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Invalid joint node");
    std::endl<char,std::char_traits<char>>(poVar4);
    local_80 = (Joint *)0x0;
  }
  else {
    this_01 = (Joint *)operator_new(0x160);
    local_88 = this;
    Joint::Joint(this_01,this);
    pXVar3 = local_98;
    local_80 = this_01;
    pXVar2 = tinyxml2::XMLNode::FirstChildElement(&local_98->super_XMLNode,"Axis");
    dVar5 = tinyxml2::XMLElement::DoubleAttribute(pXVar2,"x");
    (this_01->axis).x = dVar5;
    dVar5 = tinyxml2::XMLElement::DoubleAttribute(pXVar2,"y");
    (this_01->axis).y = dVar5;
    dVar5 = tinyxml2::XMLElement::DoubleAttribute(pXVar2,"z");
    (this_01->axis).z = dVar5;
    pXVar2 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"RenderScale");
    dVar5 = tinyxml2::XMLElement::DoubleAttribute(pXVar2,"val");
    this_01->renderScale = dVar5;
    pXVar2 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"CapsuleRadius");
    dVar5 = tinyxml2::XMLElement::DoubleAttribute(pXVar2,"val");
    this_01->capsuleRadius = dVar5;
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"Positions");
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"Knot");
    local_90 = this_01;
    for (; pXVar3 != (XMLElement *)0x0;
        pXVar3 = tinyxml2::XMLNode::NextSiblingElement(&pXVar3->super_XMLNode,"Knot")) {
      local_b0 = (Joint *)tinyxml2::XMLElement::DoubleAttribute(pXVar3,"Time");
      local_a0 = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"x");
      local_a8 = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"y");
      local_48.z = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"z");
      local_48.x = local_a0;
      local_48.y = local_a8;
      Spline<CMU462::Vector3D>::setValue
                (&(this_01->super_SceneObject).positions,(double)local_b0,&local_48);
      std::_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>::
      _M_insert_unique<double_const&>
                ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                  *)knotTimes,(double *)&local_b0);
    }
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&local_98->super_XMLNode,"Rotations");
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"Knot");
    pSVar1 = &local_90->super_SceneObject;
    for (; pXVar3 != (XMLElement *)0x0;
        pXVar3 = tinyxml2::XMLNode::NextSiblingElement(&pXVar3->super_XMLNode,"Knot")) {
      local_b0 = (Joint *)tinyxml2::XMLElement::DoubleAttribute(pXVar3,"Time");
      local_a0 = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"x");
      local_a8 = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"y");
      local_60.z = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"z");
      local_60.x = local_a0;
      local_60.y = local_a8;
      Spline<CMU462::Vector3D>::setValue(&pSVar1->rotations,(double)local_b0,&local_60);
      std::_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>::
      _M_insert_unique<double_const&>
                ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                  *)knotTimes,(double *)&local_b0);
    }
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&local_98->super_XMLNode,"Scales");
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"Knot");
    pSVar1 = &local_90->super_SceneObject;
    for (; pXVar3 != (XMLElement *)0x0;
        pXVar3 = tinyxml2::XMLNode::NextSiblingElement(&pXVar3->super_XMLNode,"Knot")) {
      local_b0 = (Joint *)tinyxml2::XMLElement::DoubleAttribute(pXVar3,"Time");
      local_a0 = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"x");
      local_a8 = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"y");
      local_78.z = tinyxml2::XMLElement::DoubleAttribute(pXVar3,"z");
      local_78.x = local_a0;
      local_78.y = local_a8;
      Spline<CMU462::Vector3D>::setValue(&pSVar1->scales,(double)local_b0,&local_78);
      std::_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>::
      _M_insert_unique<double_const&>
                ((_Rb_tree<double,double,std::_Identity<double>,std::less<double>,std::allocator<double>>
                  *)knotTimes,(double *)&local_b0);
    }
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&local_98->super_XMLNode,"Children");
    pXVar3 = tinyxml2::XMLNode::FirstChildElement(&pXVar3->super_XMLNode,"Joint");
    this_00 = local_88;
    this_02 = &local_90->kids;
    for (; pXVar3 != (XMLElement *)0x0;
        pXVar3 = tinyxml2::XMLNode::NextSiblingElement(&pXVar3->super_XMLNode,"Joint")) {
      local_b0 = loadJoint(this_00,pXVar3,knotTimes);
      local_b0->parent = local_90;
      std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
      push_back(this_02,&local_b0);
    }
    std::vector<CMU462::DynamicScene::Joint_*,_std::allocator<CMU462::DynamicScene::Joint_*>_>::
    push_back(&this_00->joints,&local_80);
  }
  return local_80;
}

Assistant:

Joint* CMU462::DynamicScene::Skeleton::loadJoint(XMLElement * jointNode, set<double> &knotTimes)
   {
     if (jointNode == nullptr)
     {
       cout << "Invalid joint node" << endl;
       return nullptr;
     }
     Joint* joint = new Joint(this);

     XMLElement* pElement = jointNode->FirstChildElement("Axis");
     joint->axis.x = pElement->DoubleAttribute("x");
     joint->axis.y = pElement->DoubleAttribute("y");
     joint->axis.z = pElement->DoubleAttribute("z");

     pElement = jointNode->FirstChildElement("RenderScale");
     joint->renderScale = pElement->DoubleAttribute("val");

     pElement = jointNode->FirstChildElement("CapsuleRadius");
     joint->capsuleRadius = pElement->DoubleAttribute("val");

     // positions
     pElement = jointNode->FirstChildElement("Positions");
     XMLElement * pListElement = pElement->FirstChildElement("Knot");
     while (pListElement != nullptr)
     {
       double time = pListElement->DoubleAttribute("Time");
       double x = pListElement->DoubleAttribute("x");
       double y = pListElement->DoubleAttribute("y");
       double z = pListElement->DoubleAttribute("z");
       Vector3D position(x, y, z);

       joint->positions.setValue(time, position);
       knotTimes.insert(time);
       pListElement = pListElement->NextSiblingElement("Knot");
     }
     
     // rotations
     pElement = jointNode->FirstChildElement("Rotations");
     pListElement = pElement->FirstChildElement("Knot");
     while (pListElement != nullptr)
     {
       double time = pListElement->DoubleAttribute("Time");
       double x = pListElement->DoubleAttribute("x");
       double y = pListElement->DoubleAttribute("y");
       double z = pListElement->DoubleAttribute("z");
       Vector3D rotation(x, y, z);

       joint->rotations.setValue(time, rotation);
       knotTimes.insert(time);
       pListElement = pListElement->NextSiblingElement("Knot");
     }

     // scales
     pElement = jointNode->FirstChildElement("Scales");
     pListElement = pElement->FirstChildElement("Knot");
     while (pListElement != nullptr)
     {
       double time = pListElement->DoubleAttribute("Time");
       double x = pListElement->DoubleAttribute("x");
       double y = pListElement->DoubleAttribute("y");
       double z = pListElement->DoubleAttribute("z");
       Vector3D scale(x, y, z);

       joint->scales.setValue(time, scale);
       knotTimes.insert(time);
       pListElement = pListElement->NextSiblingElement("Knot");
     }

     pElement = jointNode->FirstChildElement("Children");
     XMLElement* pChild = pElement->FirstChildElement("Joint");
     while (pChild != nullptr)
     {
       Joint* childJoint = loadJoint(pChild, knotTimes);
       childJoint->parent = joint;
       joint->kids.push_back(childJoint);
       pChild = pChild->NextSiblingElement("Joint");
     }

     joints.push_back(joint);

     return joint;
   }